

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metablock.c
# Opt level: O1

void BrotliBuildMetaBlock
               (MemoryManager *m,uint8_t *ringbuffer,size_t pos,size_t mask,
               BrotliEncoderParams *params,uint8_t prev_byte,uint8_t prev_byte2,Command *cmds,
               size_t num_commands,ContextType literal_context_mode,MetaBlockSplit *mb)

{
  ulong uVar1;
  BlockSplit *dist_split;
  BrotliDistanceParams *orig_params_00;
  uint32_t uVar2;
  int iVar3;
  ContextType *context_modes;
  HistogramDistance *copy_dist_histograms;
  HistogramCommand *__s;
  size_t sVar4;
  uint32_t *puVar5;
  HistogramLiteral *pHVar6;
  HistogramDistance *pHVar7;
  byte bVar8;
  long lVar9;
  uint32_t *puVar10;
  uint32_t uVar11;
  ulong uVar12;
  size_t sVar13;
  BrotliEncoderParams *pBVar14;
  BrotliEncoderParams *pBVar15;
  uint16_t *puVar16;
  uint32_t ndirect;
  size_t sVar17;
  uint32_t npostfix;
  uint uVar18;
  bool bVar19;
  bool bVar20;
  HistogramLiteral *local_1a0;
  double local_190;
  double dist_cost;
  BrotliDistanceParams *local_138;
  BrotliEncoderParams orig_params;
  BrotliEncoderParams new_params;
  
  pBVar14 = params;
  pBVar15 = &orig_params;
  for (lVar9 = 0x10; uVar2 = orig_params.dist.num_direct_distance_codes,
      uVar11 = orig_params.dist.distance_postfix_bits, lVar9 != 0; lVar9 = lVar9 + -1) {
    iVar3 = pBVar14->quality;
    pBVar15->mode = pBVar14->mode;
    pBVar15->quality = iVar3;
    pBVar14 = (BrotliEncoderParams *)&pBVar14->lgwin;
    pBVar15 = (BrotliEncoderParams *)&pBVar15->lgwin;
  }
  pBVar14 = params;
  pBVar15 = &new_params;
  for (lVar9 = 0x10; lVar9 != 0; lVar9 = lVar9 + -1) {
    iVar3 = pBVar14->quality;
    pBVar15->mode = pBVar14->mode;
    pBVar15->quality = iVar3;
    pBVar14 = (BrotliEncoderParams *)&pBVar14->lgwin;
    pBVar15 = (BrotliEncoderParams *)&pBVar15->lgwin;
  }
  orig_params_00 = &orig_params.dist;
  local_190 = 1e+99;
  local_138 = &params->dist;
  uVar18 = 0;
  bVar20 = true;
  npostfix = 0;
  do {
    if (uVar18 < 0x10) {
      do {
        ndirect = uVar18 << ((byte)npostfix & 0x1f);
        BrotliInitDistanceParams(&new_params,npostfix,ndirect);
        bVar19 = false;
        if (ndirect == uVar2 && npostfix == uVar11) {
          bVar20 = bVar19;
        }
        iVar3 = ComputeDistanceCost(cmds,num_commands,orig_params_00,&new_params.dist,&dist_cost);
        if (iVar3 != 0) {
          if (dist_cost <= local_190) {
            local_138->max_distance = new_params.dist.max_distance;
            local_138->distance_postfix_bits = new_params.dist.distance_postfix_bits;
            local_138->num_direct_distance_codes = new_params.dist.num_direct_distance_codes;
            local_138->alphabet_size = new_params.dist.alphabet_size;
            *(undefined4 *)&local_138->field_0xc = new_params.dist._12_4_;
            bVar19 = true;
            local_190 = dist_cost;
          }
          else {
            bVar19 = false;
          }
        }
        if (!bVar19) goto LAB_0012b511;
        uVar18 = uVar18 + 1;
      } while (uVar18 != 0x10);
      uVar18 = 0x10;
    }
LAB_0012b511:
    bVar19 = uVar18 == 0;
    uVar18 = uVar18 - 1 >> 1;
    if (bVar19) {
      uVar18 = 0;
    }
    npostfix = npostfix + 1;
  } while (npostfix != 4);
  if ((bVar20) &&
     (ComputeDistanceCost(cmds,num_commands,orig_params_00,orig_params_00,&dist_cost),
     dist_cost < local_190)) {
    (params->dist).max_distance = orig_params.dist.max_distance;
    (params->dist).distance_postfix_bits = orig_params.dist.distance_postfix_bits;
    (params->dist).num_direct_distance_codes = orig_params.dist.num_direct_distance_codes;
    (params->dist).alphabet_size = orig_params.dist.alphabet_size;
    *(undefined4 *)&(params->dist).field_0xc = orig_params.dist._12_4_;
  }
  if (orig_params.dist.distance_postfix_bits == (params->dist).distance_postfix_bits) {
    if ((num_commands == 0) ||
       (orig_params.dist.num_direct_distance_codes == (params->dist).num_direct_distance_codes))
    goto LAB_0012b6e3;
  }
  else if (num_commands == 0) goto LAB_0012b6e3;
  lVar9 = num_commands + (num_commands == 0);
  puVar16 = &cmds->dist_prefix_;
  do {
    if (((*(uint *)(puVar16 + -5) & 0x1ffffff) != 0) && (0x7f < puVar16[-1])) {
      uVar18 = *puVar16 & 0x3ff;
      if (orig_params.dist.num_direct_distance_codes + 0x10 <= uVar18) {
        uVar18 = (uVar18 - orig_params.dist.num_direct_distance_codes) - 0x10;
        uVar18 = (uVar18 & ~(-1 << ((byte)orig_params.dist.distance_postfix_bits & 0x1f))) +
                 orig_params.dist.num_direct_distance_codes + 0x10 +
                 ((((uVar18 >> (orig_params.dist.distance_postfix_bits & 0x1f) & 1) != 0) + 2 <<
                  ((byte)(*puVar16 >> 10) & 0x1f)) + *(uint32_t *)(puVar16 + -3) + -4 <<
                 ((byte)orig_params.dist.distance_postfix_bits & 0x1f));
      }
      uVar12 = (ulong)(params->dist).num_direct_distance_codes;
      uVar1 = uVar12 + 0x10;
      if (uVar18 < uVar1) {
        *puVar16 = (ushort)uVar18;
        uVar11 = 0;
      }
      else {
        uVar11 = (params->dist).distance_postfix_bits;
        bVar8 = (byte)uVar11;
        uVar12 = ((uVar18 - uVar12) + (4L << (bVar8 & 0x3f))) - 0x10;
        uVar18 = 0x1f;
        if ((uint)uVar12 != 0) {
          for (; (uint)uVar12 >> uVar18 == 0; uVar18 = uVar18 - 1) {
          }
        }
        uVar18 = (uVar18 ^ 0xffffffe0) + 0x1f;
        bVar20 = (uVar12 >> ((ulong)uVar18 & 0x3f) & 1) != 0;
        iVar3 = uVar18 - uVar11;
        *puVar16 = (short)((uint)bVar20 + iVar3 * 2 + 0xfffe << (bVar8 & 0x3f)) +
                   (short)uVar1 + (~(ushort)(-1 << (bVar8 & 0x1f)) & (ushort)uVar12) |
                   (short)iVar3 * 0x400;
        uVar11 = (uint32_t)(uVar12 - ((ulong)bVar20 + 2 << ((byte)uVar18 & 0x3f)) >> (bVar8 & 0x3f))
        ;
      }
      *(uint32_t *)(puVar16 + -3) = uVar11;
    }
    puVar16 = puVar16 + 8;
    lVar9 = lVar9 + -1;
  } while (lVar9 != 0);
LAB_0012b6e3:
  dist_split = &mb->distance_split;
  BrotliSplitBlock(m,cmds,num_commands,ringbuffer,pos,mask,params,&mb->literal_split,
                   &mb->command_split,dist_split);
  if (params->disable_literal_context_modeling == 0) {
    sVar13 = (mb->literal_split).num_types;
    if (sVar13 == 0) {
      context_modes = (ContextType *)0x0;
    }
    else {
      context_modes = (ContextType *)BrotliAllocate(m,sVar13 << 2);
    }
    sVar13 = (mb->literal_split).num_types;
    lVar9 = 0x40;
    if (sVar13 != 0) {
      sVar17 = 0;
      do {
        context_modes[sVar17] = literal_context_mode;
        sVar17 = sVar17 + 1;
      } while (sVar13 != sVar17);
    }
  }
  else {
    lVar9 = 1;
    context_modes = (ContextType *)0x0;
  }
  sVar13 = lVar9 * (mb->literal_split).num_types;
  if (sVar13 == 0) {
    local_1a0 = (HistogramLiteral *)0x0;
  }
  else {
    local_1a0 = (HistogramLiteral *)BrotliAllocate(m,sVar13 * 0x410);
    sVar17 = sVar13;
    pHVar6 = local_1a0;
    do {
      memset(pHVar6,0,0x408);
      pHVar6->bit_cost_ = INFINITY;
      pHVar6 = pHVar6 + 1;
      sVar17 = sVar17 - 1;
    } while (sVar17 != 0);
  }
  lVar9 = dist_split->num_types * 4;
  if (lVar9 == 0) {
    copy_dist_histograms = (HistogramDistance *)0x0;
  }
  else {
    copy_dist_histograms = (HistogramDistance *)BrotliAllocate(m,dist_split->num_types * 0x2240);
    pHVar7 = copy_dist_histograms;
    do {
      memset(pHVar7,0,0x888);
      pHVar7->bit_cost_ = INFINITY;
      pHVar7 = pHVar7 + 1;
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
  }
  sVar17 = (mb->command_split).num_types;
  mb->command_histograms_size = sVar17;
  if (sVar17 == 0) {
    __s = (HistogramCommand *)0x0;
  }
  else {
    __s = (HistogramCommand *)BrotliAllocate(m,sVar17 * 0xb10);
  }
  mb->command_histograms = __s;
  for (sVar17 = mb->command_histograms_size; sVar17 != 0; sVar17 = sVar17 - 1) {
    memset(__s,0,0xb08);
    __s->bit_cost_ = INFINITY;
    __s = __s + 1;
  }
  BrotliBuildHistogramsWithContext
            (cmds,num_commands,&mb->literal_split,&mb->command_split,dist_split,ringbuffer,pos,mask,
             prev_byte,prev_byte2,context_modes,local_1a0,mb->command_histograms,
             copy_dist_histograms);
  BrotliFree(m,context_modes);
  sVar17 = (mb->literal_split).num_types;
  sVar4 = sVar17 << 6;
  mb->literal_context_map_size = sVar4;
  if (sVar4 == 0) {
    puVar5 = (uint32_t *)0x0;
  }
  else {
    puVar5 = (uint32_t *)BrotliAllocate(m,sVar17 << 8);
  }
  mb->literal_context_map = puVar5;
  sVar17 = mb->literal_context_map_size;
  mb->literal_histograms_size = sVar17;
  if (sVar17 == 0) {
    pHVar6 = (HistogramLiteral *)0x0;
  }
  else {
    pHVar6 = (HistogramLiteral *)BrotliAllocate(m,sVar17 * 0x410);
  }
  mb->literal_histograms = pHVar6;
  BrotliClusterHistogramsLiteral
            (m,local_1a0,sVar13,0x100,pHVar6,&mb->literal_histograms_size,mb->literal_context_map);
  BrotliFree(m,local_1a0);
  if ((params->disable_literal_context_modeling != 0) &&
     (sVar13 = (mb->literal_split).num_types, sVar13 != 0)) {
    puVar5 = mb->literal_context_map;
    puVar10 = puVar5 + sVar13 * 0x40;
    do {
      sVar13 = sVar13 - 1;
      lVar9 = -0x40;
      do {
        puVar10[lVar9] = puVar5[sVar13];
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0);
      puVar10 = puVar10 + -0x40;
    } while (sVar13 != 0);
  }
  sVar17 = (mb->distance_split).num_types;
  sVar13 = sVar17 * 4;
  mb->distance_context_map_size = sVar13;
  if (sVar13 == 0) {
    puVar5 = (uint32_t *)0x0;
  }
  else {
    puVar5 = (uint32_t *)BrotliAllocate(m,sVar17 << 4);
  }
  mb->distance_context_map = puVar5;
  sVar13 = mb->distance_context_map_size;
  mb->distance_histograms_size = sVar13;
  if (sVar13 == 0) {
    pHVar7 = (HistogramDistance *)0x0;
  }
  else {
    pHVar7 = (HistogramDistance *)BrotliAllocate(m,sVar13 * 0x890);
  }
  mb->distance_histograms = pHVar7;
  BrotliClusterHistogramsDistance
            (m,copy_dist_histograms,mb->distance_context_map_size,0x100,pHVar7,
             &mb->distance_histograms_size,mb->distance_context_map);
  BrotliFree(m,copy_dist_histograms);
  return;
}

Assistant:

void BrotliBuildMetaBlock(MemoryManager* m,
                          const uint8_t* ringbuffer,
                          const size_t pos,
                          const size_t mask,
                          BrotliEncoderParams* params,
                          uint8_t prev_byte,
                          uint8_t prev_byte2,
                          Command* cmds,
                          size_t num_commands,
                          ContextType literal_context_mode,
                          MetaBlockSplit* mb) {
  /* Histogram ids need to fit in one byte. */
  static const size_t kMaxNumberOfHistograms = 256;
  HistogramDistance* distance_histograms;
  HistogramLiteral* literal_histograms;
  ContextType* literal_context_modes = NULL;
  size_t literal_histograms_size;
  size_t distance_histograms_size;
  size_t i;
  size_t literal_context_multiplier = 1;
  uint32_t npostfix;
  uint32_t ndirect_msb = 0;
  BROTLI_BOOL check_orig = BROTLI_TRUE;
  double best_dist_cost = 1e99;
  BrotliEncoderParams orig_params = *params;
  BrotliEncoderParams new_params = *params;

  for (npostfix = 0; npostfix <= BROTLI_MAX_NPOSTFIX; npostfix++) {
    for (; ndirect_msb < 16; ndirect_msb++) {
      uint32_t ndirect = ndirect_msb << npostfix;
      BROTLI_BOOL skip;
      double dist_cost;
      BrotliInitDistanceParams(&new_params, npostfix, ndirect);
      if (npostfix == orig_params.dist.distance_postfix_bits &&
          ndirect == orig_params.dist.num_direct_distance_codes) {
        check_orig = BROTLI_FALSE;
      }
      skip = !ComputeDistanceCost(
          cmds, num_commands,
          &orig_params.dist, &new_params.dist, &dist_cost);
      if (skip || (dist_cost > best_dist_cost)) {
        break;
      }
      best_dist_cost = dist_cost;
      params->dist = new_params.dist;
    }
    if (ndirect_msb > 0) ndirect_msb--;
    ndirect_msb /= 2;
  }
  if (check_orig) {
    double dist_cost;
    ComputeDistanceCost(cmds, num_commands,
                        &orig_params.dist, &orig_params.dist, &dist_cost);
    if (dist_cost < best_dist_cost) {
      best_dist_cost = dist_cost;
      params->dist = orig_params.dist;
    }
  }
  RecomputeDistancePrefixes(cmds, num_commands,
                            &orig_params.dist, &params->dist);

  BrotliSplitBlock(m, cmds, num_commands,
                   ringbuffer, pos, mask, params,
                   &mb->literal_split,
                   &mb->command_split,
                   &mb->distance_split);
  if (BROTLI_IS_OOM(m)) return;

  if (!params->disable_literal_context_modeling) {
    literal_context_multiplier = 1 << BROTLI_LITERAL_CONTEXT_BITS;
    literal_context_modes =
        BROTLI_ALLOC(m, ContextType, mb->literal_split.num_types);
    if (BROTLI_IS_OOM(m)) return;
    for (i = 0; i < mb->literal_split.num_types; ++i) {
      literal_context_modes[i] = literal_context_mode;
    }
  }

  literal_histograms_size =
      mb->literal_split.num_types * literal_context_multiplier;
  literal_histograms =
      BROTLI_ALLOC(m, HistogramLiteral, literal_histograms_size);
  if (BROTLI_IS_OOM(m)) return;
  ClearHistogramsLiteral(literal_histograms, literal_histograms_size);

  distance_histograms_size =
      mb->distance_split.num_types << BROTLI_DISTANCE_CONTEXT_BITS;
  distance_histograms =
      BROTLI_ALLOC(m, HistogramDistance, distance_histograms_size);
  if (BROTLI_IS_OOM(m)) return;
  ClearHistogramsDistance(distance_histograms, distance_histograms_size);

  BROTLI_DCHECK(mb->command_histograms == 0);
  mb->command_histograms_size = mb->command_split.num_types;
  mb->command_histograms =
      BROTLI_ALLOC(m, HistogramCommand, mb->command_histograms_size);
  if (BROTLI_IS_OOM(m)) return;
  ClearHistogramsCommand(mb->command_histograms, mb->command_histograms_size);

  BrotliBuildHistogramsWithContext(cmds, num_commands,
      &mb->literal_split, &mb->command_split, &mb->distance_split,
      ringbuffer, pos, mask, prev_byte, prev_byte2, literal_context_modes,
      literal_histograms, mb->command_histograms, distance_histograms);
  BROTLI_FREE(m, literal_context_modes);

  BROTLI_DCHECK(mb->literal_context_map == 0);
  mb->literal_context_map_size =
      mb->literal_split.num_types << BROTLI_LITERAL_CONTEXT_BITS;
  mb->literal_context_map =
      BROTLI_ALLOC(m, uint32_t, mb->literal_context_map_size);
  if (BROTLI_IS_OOM(m)) return;

  BROTLI_DCHECK(mb->literal_histograms == 0);
  mb->literal_histograms_size = mb->literal_context_map_size;
  mb->literal_histograms =
      BROTLI_ALLOC(m, HistogramLiteral, mb->literal_histograms_size);
  if (BROTLI_IS_OOM(m)) return;

  BrotliClusterHistogramsLiteral(m, literal_histograms, literal_histograms_size,
      kMaxNumberOfHistograms, mb->literal_histograms,
      &mb->literal_histograms_size, mb->literal_context_map);
  if (BROTLI_IS_OOM(m)) return;
  BROTLI_FREE(m, literal_histograms);

  if (params->disable_literal_context_modeling) {
    /* Distribute assignment to all contexts. */
    for (i = mb->literal_split.num_types; i != 0;) {
      size_t j = 0;
      i--;
      for (; j < (1 << BROTLI_LITERAL_CONTEXT_BITS); j++) {
        mb->literal_context_map[(i << BROTLI_LITERAL_CONTEXT_BITS) + j] =
            mb->literal_context_map[i];
      }
    }
  }

  BROTLI_DCHECK(mb->distance_context_map == 0);
  mb->distance_context_map_size =
      mb->distance_split.num_types << BROTLI_DISTANCE_CONTEXT_BITS;
  mb->distance_context_map =
      BROTLI_ALLOC(m, uint32_t, mb->distance_context_map_size);
  if (BROTLI_IS_OOM(m)) return;

  BROTLI_DCHECK(mb->distance_histograms == 0);
  mb->distance_histograms_size = mb->distance_context_map_size;
  mb->distance_histograms =
      BROTLI_ALLOC(m, HistogramDistance, mb->distance_histograms_size);
  if (BROTLI_IS_OOM(m)) return;

  BrotliClusterHistogramsDistance(m, distance_histograms,
                                  mb->distance_context_map_size,
                                  kMaxNumberOfHistograms,
                                  mb->distance_histograms,
                                  &mb->distance_histograms_size,
                                  mb->distance_context_map);
  if (BROTLI_IS_OOM(m)) return;
  BROTLI_FREE(m, distance_histograms);
}